

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  _Hash_node_base *p_Var1;
  _Base_ptr p_Var2;
  Column_settings *pCVar3;
  Column_settings *pCVar4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  undefined1 *puVar7;
  _List_node_base *p_Var8;
  undefined4 local_574;
  undefined4 *local_570;
  _Base_ptr local_568;
  undefined **local_560;
  ulong local_558;
  shared_count sStack_550;
  undefined4 **local_548;
  undefined8 local_540;
  uint local_538 [2];
  undefined8 *local_530;
  _Base_ptr *local_528;
  undefined1 local_520 [8];
  undefined8 local_518;
  shared_count sStack_510;
  char *local_508;
  char *local_500;
  undefined **local_4f8;
  char *local_4f0;
  undefined8 *local_4e8;
  char *local_4e0;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_4a8;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>
  ::Chain_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>
              *)&m.matrix_,&local_4a8,m.colSettings_);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       local_4a8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_4a8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bars1._M_t._M_impl._0_8_ =
       local_4a8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4a8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_4a8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bars2._M_t._M_impl._0_8_;
  local_4a8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>
            (&local_4a8,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((Underlying_matrix *)
      m.matrix_.super_Chain_vine_swap_option.super_type.
      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
      .barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != &m.matrix_) {
    p_Var8 = m.matrix_.super_Chain_vine_swap_option.super_type.
             super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
             .barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var8 + 1;
      __args_1 = (uint *)((long)&p_Var8[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var8[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var8[1]._M_prev);
      local_538[0] = *(uint *)&p_Var8[1]._M_prev;
      local_540 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_540,(uint *)((long)&local_540 + 4),local_538);
      p_Var8 = p_Var8->_M_next;
    } while ((Underlying_matrix *)p_Var8 != &m.matrix_);
  }
  p_Var2 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x574);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_568 = (_Base_ptr)&p_Var2[1]._M_parent;
  local_570 = &local_574;
  local_574 = 0;
  local_520[0] = *(int *)&p_Var2[1]._M_parent == 0;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_528 = &local_568;
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_558 = local_558 & 0xffffffffffffff00;
  local_548 = &local_570;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x575);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 0;
  local_520[0] = *(int *)&p_Var2[1].field_0x4 == 0;
  local_568 = (_Base_ptr)&p_Var2[1].field_0x4;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x577);
  local_568 = p_Var2 + 1;
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 0xffffffff;
  local_520[0] = local_568->_M_color == ~_S_red;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x579);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 0;
  local_520[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_568 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x57a);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 1;
  local_520[0] = *(int *)&p_Var6[1].field_0x4 == 1;
  local_568 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x57b);
  local_568 = p_Var6 + 1;
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 3;
  local_520[0] = local_568->_M_color == 3;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_288,0x57d);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 0;
  local_520[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_568 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a8,0x57e);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 2;
  local_520[0] = *(int *)&p_Var6[1].field_0x4 == 2;
  local_568 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c8,0x57f);
  local_568 = p_Var6 + 1;
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 4;
  local_520[0] = local_568->_M_color == 4;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0x581);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 0;
  local_520[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_568 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_308,0x582);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 7;
  local_520[0] = *(int *)&p_Var6[1].field_0x4 == 7;
  local_568 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x583);
  local_568 = p_Var6 + 1;
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 8;
  local_520[0] = local_568->_M_color == 8;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_348,0x585);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 1;
  local_520[0] = *(int *)&p_Var6[1]._M_parent == 1;
  local_568 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_368,0x586);
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 5;
  local_520[0] = *(int *)&p_Var6[1].field_0x4 == 5;
  local_568 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_510);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_388,0x587);
  local_568 = p_Var6 + 1;
  local_4f0 = (char *)((ulong)local_4f0 & 0xffffffffffffff00);
  local_4f8 = &PTR__lazy_ostream_001a35e0;
  local_4e8 = &boost::unit_test::lazy_ostream::inst;
  local_4e0 = "";
  local_574 = 6;
  local_520[0] = local_568->_M_color == 6;
  local_518 = 0;
  sStack_510.pi_ = (sp_counted_base *)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a35a0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = &local_568;
  local_570 = &local_574;
  local_558 = local_558 & 0xffffffffffffff00;
  local_560 = &PTR__lazy_ostream_001a35a0;
  sStack_550.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_548 = &local_570;
  boost::test_tools::tt_detail::report_assertion
            (local_520,&local_4f8,&local_508,0x587,1,2,2,"std::get<2>(*it)",&local_540,"6",
             &local_560);
  boost::detail::shared_count::~shared_count(&sStack_510);
  puVar7 = (undefined1 *)std::_Rb_tree_increment(p_Var6);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a8,0x589);
  local_560 = (undefined **)
              CONCAT71(local_560._1_7_,
                       (_Rb_tree_header *)puVar7 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_4f8 = (undefined **)0x1826d4;
  local_4f0 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a36e0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c0 = "";
  local_528 = (_Base_ptr *)&local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d8,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar5 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar5 = false;
  }
  local_560 = (undefined **)CONCAT71(local_560._1_7_,bVar5);
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_4f8 = (undefined **)0x1826e6;
  local_4f0 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a36e0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f0 = "";
  local_528 = (_Base_ptr *)&local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_400 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_408,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar5 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar5 = false;
  }
  local_560 = (undefined **)CONCAT71(local_560._1_7_,bVar5);
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_4f8 = (undefined **)0x1826f5;
  local_4f0 = "";
  local_538[0] = local_538[0] & 0xffffff00;
  local_540 = &PTR__lazy_ostream_001a36e0;
  local_530 = &boost::unit_test::lazy_ostream::inst;
  local_528 = (_Base_ptr *)&local_4f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  pCVar3 = m.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&m.matrix_.matrix_._M_h);
  while (m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var1 = (m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var1;
  }
  memset(m.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         m.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar4 = m.colSettings_;
  m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  m.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  m.matrix_.nextIndex_ = 0;
  m.matrix_.colSettings_ = pCVar3;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
  }
  operator_delete(pCVar4,0x38);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false>_>_>
  ::~Chain_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_4a8);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}